

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O0

void __thiscall
QMimeBinaryProvider::addFileNameMatches
          (QMimeBinaryProvider *this,QString *fileName,QMimeGlobMatchResult *result)

{
  bool bVar1;
  int iVar2;
  quint32 qVar3;
  QMimeGlobMatchResult *result_00;
  qsizetype qVar4;
  CacheFile *in_RDX;
  QString *in_RSI;
  QMimeBinaryProvider *in_RDI;
  long in_FS_OFFSET;
  int firstRootOffset;
  int numRoots;
  int reverseSuffixTreeOffset;
  int numMatches;
  QString lowerFileName;
  QString *in_stack_ffffffffffffff08;
  int iVar5;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff78;
  quint32 in_stack_ffffffffffffff7c;
  quint32 in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffffa0;
  quint32 numEntries;
  undefined4 in_stack_ffffffffffffffac;
  QMimeGlobMatchResult *in_stack_ffffffffffffffb0;
  quint32 qVar6;
  QString local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x8f94c1);
  if (!bVar1) {
    result_00 = (QMimeGlobMatchResult *)
                std::
                unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                ::get((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                       *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    std::
    unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
    ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                  *)0x8f9511);
    CacheFile::getUint32
              ((CacheFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               (int)((ulong)in_stack_ffffffffffffff08 >> 0x20));
    iVar2 = matchGlobList(in_RDI,result_00,in_RDX,in_stack_ffffffffffffff84,
                          (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    if (iVar2 == 0) {
      local_28.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      local_28.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QString::toLower(in_stack_ffffffffffffff08);
      iVar5 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    *)0x8f95a1);
      in_stack_ffffffffffffff84 =
           CacheFile::getUint32
                     ((CacheFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      iVar5);
      qVar6 = in_stack_ffffffffffffff84;
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    *)0x8f95d0);
      qVar3 = CacheFile::getUint32
                        ((CacheFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         iVar5);
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    *)0x8f9601);
      in_stack_ffffffffffffff7c =
           CacheFile::getUint32
                     ((CacheFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                      iVar5);
      numEntries = in_stack_ffffffffffffff7c;
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::get((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      qVar4 = QString::size(&local_28);
      in_stack_ffffffffffffff08 = (QString *)(qVar4 + -1);
      in_stack_ffffffffffffff10 = 0;
      bVar1 = matchSuffixTree((QMimeBinaryProvider *)CONCAT44(iVar2,qVar6),in_stack_ffffffffffffffb0
                              ,(CacheFile *)CONCAT44(in_stack_ffffffffffffffac,qVar3),numEntries,
                              in_stack_ffffffffffffffa0,(QString *)in_RDI,_reverseSuffixTreeOffset,
                              SUB81((ulong)result_00 >> 0x38,0));
      in_stack_ffffffffffffff78 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff78);
      if (bVar1) {
        iVar2 = iVar2 + 1;
      }
      else {
        std::
        unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
        ::get((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
               *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
        qVar4 = QString::size(in_RSI);
        in_stack_ffffffffffffff08 = (QString *)(qVar4 + -1);
        in_stack_ffffffffffffff10 = 1;
        bVar1 = matchSuffixTree((QMimeBinaryProvider *)CONCAT44(iVar2,qVar6),
                                in_stack_ffffffffffffffb0,
                                (CacheFile *)CONCAT44(in_stack_ffffffffffffffac,qVar3),numEntries,
                                in_stack_ffffffffffffffa0,(QString *)in_RDI,_reverseSuffixTreeOffset
                                ,SUB81((ulong)result_00 >> 0x38,0));
        if (bVar1) {
          iVar2 = iVar2 + 1;
        }
      }
      QString::~QString((QString *)0x8f97aa);
    }
    iVar5 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
    if (iVar2 == 0) {
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::get((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
             *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      std::
      unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
      ::operator->((unique_ptr<QMimeBinaryProvider::CacheFile,_std::default_delete<QMimeBinaryProvider::CacheFile>_>
                    *)0x8f97e8);
      CacheFile::getUint32
                ((CacheFile *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar5);
      matchGlobList(in_RDI,result_00,in_RDX,in_stack_ffffffffffffff84,
                    (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMimeBinaryProvider::addFileNameMatches(const QString &fileName, QMimeGlobMatchResult &result)
{
    if (fileName.isEmpty())
        return;
    Q_ASSERT(m_cacheFile);
    int numMatches = 0;
    // Check literals (e.g. "Makefile")
    numMatches = matchGlobList(result, m_cacheFile.get(),
                               m_cacheFile->getUint32(PosLiteralListOffset), fileName);
    // Check the very common *.txt cases with the suffix tree
    if (numMatches == 0) {
        const QString lowerFileName = fileName.toLower();
        const int reverseSuffixTreeOffset = m_cacheFile->getUint32(PosReverseSuffixTreeOffset);
        const int numRoots = m_cacheFile->getUint32(reverseSuffixTreeOffset);
        const int firstRootOffset = m_cacheFile->getUint32(reverseSuffixTreeOffset + 4);
        if (matchSuffixTree(result, m_cacheFile.get(), numRoots, firstRootOffset, lowerFileName,
                            lowerFileName.size() - 1, false)) {
            ++numMatches;
        } else if (matchSuffixTree(result, m_cacheFile.get(), numRoots, firstRootOffset, fileName,
                                   fileName.size() - 1, true)) {
            ++numMatches;
        }
    }
    // Check complex globs (e.g. "callgrind.out[0-9]*" or "README*")
    if (numMatches == 0)
        matchGlobList(result, m_cacheFile.get(), m_cacheFile->getUint32(PosGlobListOffset),
                      fileName);
}